

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O2

mp_int * eddsa_exponent_from_hash(ptrlen hash,ec_curve *curve)

{
  mp_int *x;
  uint bit;
  ulong bit_00;
  ptrlen bytes;
  
  bytes.ptr = hash.ptr;
  if (curve->fieldBytes <= hash.len) {
    bytes.len = curve->fieldBytes;
    x = mp_from_bytes_le(bytes);
    mp_set_bit(x,curve->fieldBits - 1,1);
    mp_reduce_mod_2to(x,curve->fieldBits);
    for (bit_00 = 0; bit_00 < (curve->field_6).e.log2_cofactor; bit_00 = bit_00 + 1) {
      mp_set_bit(x,bit_00,0);
    }
    return x;
  }
  __assert_fail("hash.len >= curve->fieldBytes",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-ssh.c"
                ,0x161,"mp_int *eddsa_exponent_from_hash(ptrlen, const struct ec_curve *)");
}

Assistant:

static mp_int *eddsa_exponent_from_hash(
    ptrlen hash, const struct ec_curve *curve)
{
    /*
     * Make an integer out of the hash data, little-endian.
     */
    assert(hash.len >= curve->fieldBytes);
    mp_int *e = mp_from_bytes_le(make_ptrlen(hash.ptr, curve->fieldBytes));

    /*
     * Set the highest bit that fits in the modulus, and clear any
     * above that.
     */
    mp_set_bit(e, curve->fieldBits - 1, 1);
    mp_reduce_mod_2to(e, curve->fieldBits);

    /*
     * Clear a curve-specific number of low bits.
     */
    for (unsigned bit = 0; bit < curve->e.log2_cofactor; bit++)
        mp_set_bit(e, bit, 0);

    return e;
}